

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplashscreen.cpp
# Opt level: O1

void __thiscall
QSplashScreen::QSplashScreen(QSplashScreen *this,QScreen *screen,QPixmap *pixmap,WindowFlags f)

{
  QWidgetPrivate *this_00;
  
  this_00 = (QWidgetPrivate *)operator_new(0x2a0);
  QWidgetPrivate::QWidgetPrivate(this_00,QObjectPrivateVersion);
  *(undefined ***)this_00 = &PTR__QSplashScreenPrivate_00808bf0;
  QPixmap::QPixmap((QPixmap *)(this_00 + 1));
  *(undefined8 *)&this_00[1].field_0x24 = 0;
  *(undefined8 *)&this_00[1].field_0x2c = 0;
  *(undefined8 *)&this_00[1].field_0x18 = 0;
  *(undefined8 *)&this_00[1].field_0x20 = 0;
  *(undefined2 *)&this_00[1].field_0x34 = 0xffff;
  *(undefined8 *)&this_00[1].field_0x36 = 0;
  *(undefined4 *)&this_00[1].field_0x40 = 1;
  QWidget::QWidget(&this->super_QWidget,this_00,(QWidget *)0x0,
                   (WindowFlags)
                   ((uint)f.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                          super_QFlagsStorage<Qt::WindowType>.i | 0x80f));
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_00808930;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QSplashScreen_00808ae8;
  QWidgetPrivate::setScreen(*(QWidgetPrivate **)&(this->super_QWidget).field_0x8,screen);
  setPixmap(this,pixmap);
  return;
}

Assistant:

QSplashScreen::QSplashScreen(QScreen *screen, const QPixmap &pixmap, Qt::WindowFlags f)
    : QWidget(*(new QSplashScreenPrivate()), nullptr, Qt::SplashScreen | Qt::FramelessWindowHint | f)
{
    Q_D(QSplashScreen);
    d->setScreen(screen);
    setPixmap(pixmap);
}